

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

int32_t player_adjust_mana_precise(player *p,int32_t sp_gain)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int32_t remainder;
  int32_t new_32;
  int32_t old_32;
  int16_t old_16;
  int32_t sp_gain_local;
  player *p_local;
  
  sVar1 = p->csp;
  iVar2 = CONCAT22(p->csp,p->csp_frac);
  if (sp_gain == 0) {
    p_local._4_4_ = 0;
  }
  else {
    old_32 = sp_gain;
    if (sp_gain < 1) {
      if (-0x80000000 - sp_gain < iVar2) {
        local_28 = iVar2 + sp_gain;
      }
      else {
        local_28 = -0x80000000;
        old_32 = 0;
      }
    }
    else if (iVar2 < 0x7fffffff - sp_gain) {
      local_28 = iVar2 + sp_gain;
    }
    else {
      local_28 = 0x7fffffff;
      old_32 = 0;
    }
    if (local_28 < 0) {
      iVar3 = local_28 % 0x10000;
      p->csp = (int16_t)((long)local_28 / 0x10000);
      if (iVar3 == 0) {
        p->csp_frac = 0;
      }
      else {
        if (-1 < iVar3) {
          __assert_fail("remainder < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                        ,0x2d9,"int32_t player_adjust_mana_precise(struct player *, int32_t)");
        }
        p->csp_frac = (uint16_t)iVar3;
        if (p->csp < -0x7fff) {
          __assert_fail("p->csp > INT16_MIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                        ,0x2db,"int32_t player_adjust_mana_precise(struct player *, int32_t)");
        }
        p->csp = p->csp + -1;
      }
    }
    else {
      p->csp = (int16_t)((uint)local_28 >> 0x10);
      p->csp_frac = (uint16_t)local_28;
    }
    if (p->csp < p->msp) {
      if (p->csp < 0) {
        p->csp = 0;
        p->csp_frac = 0;
        old_32 = 0;
      }
    }
    else {
      p->csp = p->msp;
      p->csp_frac = 0;
      old_32 = 0;
    }
    if (sVar1 != p->csp) {
      p->upkeep->redraw = p->upkeep->redraw | 0x80;
    }
    if (old_32 == 0) {
      old_32 = CONCAT22(p->csp,p->csp_frac) - iVar2;
    }
    p_local._4_4_ = old_32;
  }
  return p_local._4_4_;
}

Assistant:

int32_t player_adjust_mana_precise(struct player *p, int32_t sp_gain)
{
	int16_t old_16 = p->csp;
	/* Load it all into 4 byte format*/
	int32_t old_32 = ((int32_t) p->csp) * 65536 + p->csp_frac, new_32;

	if (sp_gain == 0) return 0;

	/* Check for overflow */
	if (sp_gain > 0) {
		if (old_32 < INT32_MAX - sp_gain) {
			new_32 = old_32 + sp_gain;
		} else {
			new_32 = INT32_MAX;
			sp_gain = 0;
		}
	} else if (old_32 > INT32_MIN - sp_gain) {
		new_32 = old_32 + sp_gain;
	} else {
		new_32 = INT32_MIN;
		sp_gain = 0;
	}

	/* Break it back down*/
	if (new_32 < 0) {
		/*
		 * Don't use right bitwise shift on negative values:  whether
		 * the left bits are zero or one depends on the system.
		 */
		int32_t remainder = new_32 % 65536;

		p->csp = (int16_t) (new_32 / 65536);
		if (remainder) {
			assert(remainder < 0);
			p->csp_frac = (uint16_t) (65536 + remainder);
			assert(p->csp > INT16_MIN);
			p->csp -= 1;
		} else {
			p->csp_frac = 0;
		}
	} else {
		p->csp = (int16_t)(new_32 >> 16);   /* div 65536 */
		p->csp_frac = (uint16_t)(new_32 & 0xFFFF);    /* mod 65536 */
	}

	/* Max/min SP */
	if (p->csp >= p->msp) {
		p->csp = p->msp;
		p->csp_frac = 0;
		sp_gain = 0;
	} else if (p->csp < 0) {
		p->csp = 0;
		p->csp_frac = 0;
		sp_gain = 0;
	}

	/* Notice changes */
	if (old_16 != p->csp) {
		p->upkeep->redraw |= (PR_MANA);
	}

	if (sp_gain == 0) {
		/* Recalculate */
		new_32 = ((int32_t) p->csp) * 65536 + p->csp_frac;
		sp_gain = new_32 - old_32;
	}

	return sp_gain;
}